

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.hpp
# Opt level: O0

void __thiscall
Commands::command_handler::command_handler
          (command_handler *this,command_info *info,
          function<void_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_Command_Source_*)>
          *f)

{
  function<void_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_Command_Source_*)>
  *f_local;
  command_info *info_local;
  command_handler *this_local;
  
  command_info::command_info(&this->info,info);
  std::
  function<void_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_Command_Source_*)>
  ::function(&this->f,f);
  return;
}

Assistant:

command_handler(command_info info, std::function<void(const std::vector<std::string>&, Command_Source*)> f)
		: info(info)
		, f(f)
	{ }